

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeMassMatrix(ChElementHexaANCF_3813_9 *this)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  ActualDstType actualDst;
  Brick9_Mass myformula;
  ChIntegrable3D<Eigen::Matrix<double,_33,_33,_1,_33,_33>_> local_28;
  ChElementHexaANCF_3813_9 *local_20;
  
  local_28._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_00b5dc08;
  local_20 = this;
  memset(&this->m_MassMatrix,0,0x2208);
  ChQuadrature::Integrate3D<Eigen::Matrix<double,33,33,1,33,33>>
            (&this->m_MassMatrix,&local_28,-1.0,1.0,-1.0,1.0,-1.0,1.0,3);
  dVar3 = (((this->m_material).
            super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->super_ChContinuumMaterial).density;
  (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>.m_storage.
  m_data.array[0] =
       dVar3 * (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>
               .m_storage.m_data.array[0];
  uVar5 = 0xffffffffffffffff;
  do {
    pdVar1 = (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>.
             m_storage.m_data.array + uVar5 + 2;
    dVar4 = pdVar1[1];
    pdVar2 = (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>.
             m_storage.m_data.array + uVar5 + 2;
    *pdVar2 = dVar3 * *pdVar1;
    pdVar2[1] = dVar3 * dVar4;
    uVar5 = uVar5 + 2;
  } while (uVar5 < 0x43f);
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeMassMatrix() {
    Brick9_Mass myformula(this);
    m_MassMatrix.setZero();
    ChQuadrature::Integrate3D<ChMatrixNM<double, 33, 33>>(m_MassMatrix,  // result of integration will go there
                                                          myformula,     // formula to integrate
                                                          -1, 1,         // limits in x direction
                                                          -1, 1,         // limits in y direction
                                                          -1, 1,         // limits in z direction
                                                          3              // order of integration
    );

    m_MassMatrix *= m_material->Get_density();
}